

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<Job,_std::shared_ptr<Job>_> * __thiscall
pybind11::class_<Job,std::shared_ptr<Job>>::def_property<std::__cxx11::string(Job::*)()const>
          (class_<Job,std::shared_ptr<Job>> *this,char *name,offset_in_Job_to_subr *fget,
          cpp_function *fset)

{
  class_<Job,_std::shared_ptr<Job>_> *pcVar1;
  return_value_policy local_29;
  cpp_function local_28;
  
  cpp_function::cpp_function<std::__cxx11::string,Job>(&local_28,*fget);
  local_29 = reference_internal;
  pcVar1 = class_<Job,_std::shared_ptr<Job>_>::def_property<pybind11::return_value_policy>
                     ((class_<Job,_std::shared_ptr<Job>_> *)this,name,&local_28,fset,&local_29);
  object::~object((object *)&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(fget), fset, return_value_policy::reference_internal, extra...);
    }